

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O1

void test_many<int>(void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  uint d;
  size_t sVar8;
  random_numerators<int> data;
  TestResult local_1b0;
  char type_buffer [64];
  char buffer [128];
  
  snprintf(type_buffer,0x40,"=== libdivide %s benchmark ===","s32");
  snprintf(buffer,0x80,"\n%50s\n\n",type_buffer);
  sVar8 = strlen(buffer);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,buffer,sVar8);
  snprintf(buffer,0x100,"%6s %10s %10s %10s %10s %10s %10s %6s\n","#","system","scalar","scl_bf",
           "vector","vec_bf","gener","algo");
  sVar8 = strlen(buffer);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,buffer,sVar8);
  random_numerators<int>::random_numerators(&data);
  d = 1;
  do {
    test_one<int>(&local_1b0,d,&data);
    iVar7 = local_1b0.algo;
    dVar6 = local_1b0.gen_time;
    dVar5 = local_1b0.vector_branchfree_time;
    dVar4 = local_1b0.vector_time;
    dVar3 = local_1b0.branchfree_time;
    dVar2 = local_1b0.base_time;
    dVar1 = local_1b0.hardware_time;
    snprintf(type_buffer,0x20,"%d",(ulong)d);
    snprintf(buffer,0x100,"%6s %10.3f %10.3f %10.3f %10.3f %10.3f %10.3f %4d\n",dVar1,dVar2,dVar3,
             dVar4,dVar5,dVar6,type_buffer,(ulong)(uint)iVar7);
    sVar8 = strlen(buffer);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,buffer,sVar8);
    d = -d - ((int)d >> 0x1f);
  } while( true );
}

Assistant:

static void print_banner() {
    char type_buffer[64];
    snprintf(type_buffer, sizeof type_buffer,
        "=== libdivide %s benchmark ===", type_tag<_IntT>::get_tag());
    char buffer[128];
    snprintf(buffer, sizeof buffer, "\n%50s\n\n", type_buffer);
    PRINT_INFO(buffer);
}